

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::CopyBuffer::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  Implementation *this_00;
  DefaultDeleter<vkt::synchronization::Operation> local_35 [13];
  Resource *local_28;
  Resource *resource_local;
  OperationContext *context_local;
  Support *this_local;
  
  local_28 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  this_local = (Support *)__return_storage_ptr__;
  this_00 = (Implementation *)operator_new(0x30);
  CopyBuffer::Implementation::Implementation
            (this_00,(OperationContext *)resource_local,local_28,this->m_mode);
  de::DefaultDeleter<vkt::synchronization::Operation>::DefaultDeleter(local_35);
  de::details::
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>::
  MovePtr(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource, m_mode));
	}